

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int stb_vorbis_seek_start(stb_vorbis *f)

{
  int iVar1;
  stb_vorbis *in_RDI;
  
  set_file_offset(in_RDI,0);
  in_RDI->previous_length = 0;
  in_RDI->first_decode = '\x01';
  in_RDI->next_seg = -1;
  iVar1 = vorbis_pump_first_frame(f);
  return iVar1;
}

Assistant:

int stb_vorbis_seek_start(stb_vorbis *f)
{
   if (IS_PUSH_MODE(f)) { return error(f, VORBIS_invalid_api_mixing); }
   set_file_offset(f, f->first_audio_page_offset);
   f->previous_length = 0;
   f->first_decode = TRUE;
   f->next_seg = -1;
   return vorbis_pump_first_frame(f);
}